

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL_gpu.c
# Opt level: O3

void GPU_GetVirtualCoords(GPU_Target *target,float *x,float *y,float displayX,float displayY)

{
  ushort uVar1;
  GPU_Context *pGVar2;
  GPU_Image *pGVar3;
  GPU_Renderer *pGVar4;
  uint uVar5;
  
  pGVar4 = _gpu_current_renderer;
  if (_gpu_current_renderer == (GPU_Renderer *)0x0 || target == (GPU_Target *)0x0) {
    return;
  }
  pGVar2 = target->context;
  if (pGVar2 == (GPU_Context *)0x0) {
    pGVar3 = target->image;
    if (pGVar3 != (GPU_Image *)0x0) {
      if (x != (float *)0x0) {
        *x = ((float)target->w * displayX) / (float)pGVar3->w;
      }
      if (y == (float *)0x0) goto LAB_0017180a;
      uVar1 = target->h;
      uVar5 = (uint)pGVar3->h;
      goto LAB_001717fb;
    }
    if (x != (float *)0x0) {
      *x = displayX;
    }
    if (y == (float *)0x0) goto LAB_0017180a;
  }
  else {
    if (x != (float *)0x0) {
      *x = ((float)target->w * displayX) / (float)pGVar2->window_w;
    }
    if (y == (float *)0x0) goto LAB_0017180a;
    uVar1 = target->h;
    uVar5 = pGVar2->window_h;
LAB_001717fb:
    displayY = ((float)uVar1 * displayY) / (float)(int)uVar5;
  }
  *y = displayY;
LAB_0017180a:
  if (pGVar4->coordinate_mode == true) {
    *y = (float)target->h - *y;
  }
  return;
}

Assistant:

void GPU_GetVirtualCoords(GPU_Target* target, float* x, float* y, float displayX, float displayY)
{
    if(target == NULL || _gpu_current_renderer == NULL)
        return;

    // Scale from raw window/image coords to the virtual scale
    if(target->context != NULL)
    {
        if(x != NULL)
            *x = (displayX*target->w)/target->context->window_w;
        if(y != NULL)
            *y = (displayY*target->h)/target->context->window_h;
    }
    else if(target->image != NULL)
    {
        if(x != NULL)
            *x = (displayX*target->w)/target->image->w;
        if(y != NULL)
            *y = (displayY*target->h)/target->image->h;
    }
    else
    {
        // What is the backing for this target?!
        if(x != NULL)
            *x = displayX;
        if(y != NULL)
            *y = displayY;
    }
    
    // Invert coordinates to math coords
    if(_gpu_current_renderer->coordinate_mode)
        *y = target->h - *y;
}